

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_int32_t seqindex_decode_entry(utf8proc_uint16_t **entry)

{
  uint local_14;
  utf8proc_int32_t entry_cp;
  utf8proc_uint16_t **entry_local;
  
  local_14 = (uint)**entry;
  if ((local_14 & 0xf800) == 0xd800) {
    *entry = *entry + 1;
    local_14 = ((local_14 & 0x3ff) << 10 | **entry & 0x3ff) + 0x10000;
  }
  return local_14;
}

Assistant:

static utf8proc_int32_t seqindex_decode_entry(const utf8proc_uint16_t **entry)
{
  utf8proc_int32_t entry_cp = **entry;
  if ((entry_cp & 0xF800) == 0xD800) {
    *entry = *entry + 1;
    entry_cp = ((entry_cp & 0x03FF) << 10) | (**entry & 0x03FF);
    entry_cp += 0x10000;
  }
  return entry_cp;
}